

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spv::Capability,_8UL> * __thiscall
spirv_cross::SmallVector<spv::Capability,_8UL>::operator=
          (SmallVector<spv::Capability,_8UL> *this,SmallVector<spv::Capability,_8UL> *other)

{
  ulong local_28;
  size_t i;
  SmallVector<spv::Capability,_8UL> *other_local;
  SmallVector<spv::Capability,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spv::Capability>).buffer_size);
    for (local_28 = 0; local_28 < (other->super_VectorView<spv::Capability>).buffer_size;
        local_28 = local_28 + 1) {
      (this->super_VectorView<spv::Capability>).ptr[local_28] =
           (other->super_VectorView<spv::Capability>).ptr[local_28];
    }
    (this->super_VectorView<spv::Capability>).buffer_size =
         (other->super_VectorView<spv::Capability>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}